

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void SimpleScene(Stage *stage)

{
  size_t *this;
  reference pvVar1;
  AttrMeta *pAVar2;
  Variability *pVVar3;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *pvVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_bool>
  pVar5;
  undefined1 local_8f58 [8];
  Prim xformPrim;
  Prim meshPrim;
  undefined1 local_88a8 [8];
  Property prop;
  undefined1 local_82c0 [8];
  AttrMeta meta_1;
  PrimVar var;
  double myvalue;
  Attribute attrib;
  undefined1 local_7db8 [8];
  Property uvIndexProp;
  PrimVar uvIndexVar;
  value_type_conflict1 local_7790 [2];
  undefined1 local_7788 [8];
  vector<int,_std::allocator<int>_> uvIndices;
  Attribute uvIndexAttr;
  undefined1 local_74b8 [8];
  Property uvProp;
  optional<tinyusdz::Interpolation> local_6ed0;
  undefined1 local_6ec8 [8];
  AttrMeta meta;
  value_type local_6cb8;
  value_type local_6cb0;
  value_type local_6ca8;
  undefined1 local_6ca0 [8];
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> uvs;
  Attribute uvAttr;
  value_type_conflict1 local_69a0 [6];
  Animatable<std::vector<int,_std::allocator<int>_>_> local_6988;
  value_type_conflict1 local_6948 [2];
  undefined1 local_6940 [8];
  vector<int,_std::allocator<int>_> counts;
  vector<int,_std::allocator<int>_> indices;
  value_type local_68d0;
  value_type local_68c4;
  value_type local_68b8;
  value_type local_68ac;
  undefined1 local_68a0 [8];
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> pts;
  GeomMesh mesh;
  double3 translate;
  XformOp op;
  undefined1 local_1e78 [8];
  Xform xform;
  Stage *stage_local;
  
  xform.super_GPrim._variantSetMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)stage;
  tinyusdz::Xform::Xform((Xform *)local_1e78);
  std::__cxx11::string::operator=
            ((string *)((long)&xform.super_GPrim.super_Collection._instances._m._M_t._M_impl + 0x28)
             ,"root");
  tinyusdz::XformOp::XformOp((XformOp *)(translate._M_elems + 2));
  translate._M_elems[2]._0_4_ = 1;
  this = &mesh.subsetFamilyTypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pvVar1 = std::array<double,_3UL>::operator[]((array<double,_3UL> *)this,0);
  *pvVar1 = 1.0;
  pvVar1 = std::array<double,_3UL>::operator[]((array<double,_3UL> *)this,1);
  *pvVar1 = 2.0;
  pvVar1 = std::array<double,_3UL>::operator[]((array<double,_3UL> *)this,2);
  *pvVar1 = 3.0;
  tinyusdz::XformOp::set_value<std::array<double,3ul>>
            ((XformOp *)(translate._M_elems + 2),(array<double,_3UL> *)this);
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::push_back
            ((vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)local_1e78,
             (value_type *)(translate._M_elems + 2));
  tinyusdz::GeomMesh::GeomMesh
            ((GeomMesh *)
             &pts.
              super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::operator=
            ((string *)((long)&mesh.super_GPrim.super_Collection._instances._m._M_t._M_impl + 0x28),
             "quad");
  std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::vector
            ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
             local_68a0);
  local_68ac.x = 0.0;
  local_68ac.y = 0.0;
  local_68ac.z = 0.0;
  std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::push_back
            ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
             local_68a0,&local_68ac);
  local_68b8.x = 1.0;
  local_68b8.y = 0.0;
  local_68b8.z = 0.0;
  std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::push_back
            ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
             local_68a0,&local_68b8);
  local_68c4.x = 1.0;
  local_68c4.y = 1.0;
  local_68c4.z = 0.0;
  std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::push_back
            ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
             local_68a0,&local_68c4);
  local_68d0.x = 0.0;
  local_68d0.y = 1.0;
  local_68d0.z = 0.0;
  std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::push_back
            ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
             local_68a0,&local_68d0);
  tinyusdz::
  Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::
  Animatable((Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
              *)&indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
             (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
             local_68a0);
  tinyusdz::
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
  ::set_value((TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
               *)&mesh.super_GPrim._variantSetMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
              (Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
               *)&indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  tinyusdz::
  Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::
  ~Animatable((Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
               *)&indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::~vector
            ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
             local_68a0);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_6940);
  local_6948[1] = 3;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_6940,local_6948 + 1);
  local_6948[0] = 3;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_6940,local_6948);
  tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>::Animatable
            (&local_6988,(vector<int,_std::allocator<int>_> *)local_6940);
  tinyusdz::TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::
  set_value((TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
            &mesh.velocities._blocked,&local_6988);
  tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>::~Animatable(&local_6988);
  local_69a0[5] = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             &counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,local_69a0 + 5);
  local_69a0[4] = 1;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             &counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,local_69a0 + 4);
  local_69a0[3] = 2;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             &counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,local_69a0 + 3);
  local_69a0[2] = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             &counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,local_69a0 + 2);
  local_69a0[1] = 2;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             &counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,local_69a0 + 1);
  local_69a0[0] = 3;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             &counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,local_69a0);
  tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>::Animatable
            ((Animatable<std::vector<int,_std::allocator<int>_>_> *)
             &uvAttr._metas.stringData.
              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)
             &counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  tinyusdz::TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::
  set_value((TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
            &mesh.faceVertexCounts._blocked,
            (Animatable<std::vector<int,_std::allocator<int>_>_> *)
            &uvAttr._metas.stringData.
             super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>::~Animatable
            ((Animatable<std::vector<int,_std::allocator<int>_>_> *)
             &uvAttr._metas.stringData.
              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_6940);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  tinyusdz::Attribute::Attribute
            ((Attribute *)
             &uvs.
              super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::vector
            ((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *)
             local_6ca0);
  local_6ca8.s = 0.0;
  local_6ca8.t = 0.0;
  std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::push_back
            ((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *)
             local_6ca0,&local_6ca8);
  local_6cb0.s = 1.0;
  local_6cb0.t = 0.0;
  std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::push_back
            ((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *)
             local_6ca0,&local_6cb0);
  local_6cb8.s = 1.0;
  local_6cb8.t = 1.0;
  std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::push_back
            ((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *)
             local_6ca0,&local_6cb8);
  meta.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  meta.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x3f800000;
  std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::push_back
            ((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *)
             local_6ca0,
             (value_type *)
             &meta.stringData.
              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tinyusdz::Attribute::
  set_value<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
            ((Attribute *)
             &uvs.
              super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *)
             local_6ca0);
  tinyusdz::AttrMetas::AttrMetas((AttrMetas *)local_6ec8);
  uvProp._1500_4_ = 3;
  nonstd::optional_lite::optional<tinyusdz::Interpolation>::optional<tinyusdz::Interpolation,_0>
            (&local_6ed0,(Interpolation *)&uvProp.field_0x5dc);
  nonstd::optional_lite::optional<tinyusdz::Interpolation>::operator=
            ((optional<tinyusdz::Interpolation> *)local_6ec8,&local_6ed0);
  nonstd::optional_lite::optional<tinyusdz::Interpolation>::~optional(&local_6ed0);
  pAVar2 = tinyusdz::Attribute::metas
                     ((Attribute *)
                      &uvs.
                       super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tinyusdz::AttrMetas::operator=(pAVar2,(AttrMetas *)local_6ec8);
  tinyusdz::Property::Property
            ((Property *)local_74b8,
             (Attribute *)
             &uvs.
              super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
  std::
  map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
  ::emplace<char_const(&)[12],tinyusdz::Property&>
            ((map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
              *)&mesh.super_GPrim.proxyPrim._relationship._varying_authored,
             (char (*) [12])"primvars:uv",(Property *)local_74b8);
  tinyusdz::Attribute::Attribute
            ((Attribute *)
             &uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_7788);
  local_7790[1] = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_7788,local_7790 + 1);
  local_7790[0] = 1;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_7788,local_7790);
  uvIndexVar._ts._28_4_ = 2;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_7788,
             (value_type_conflict1 *)&uvIndexVar._ts.field_0x1c);
  uvIndexVar._ts._dirty = true;
  uvIndexVar._ts._25_3_ = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_7788,
             (value_type_conflict1 *)&uvIndexVar._ts._dirty);
  tinyusdz::primvar::PrimVar::PrimVar((PrimVar *)&uvIndexProp._has_custom);
  tinyusdz::primvar::PrimVar::set_value<std::vector<int,std::allocator<int>>>
            ((PrimVar *)&uvIndexProp._has_custom,(vector<int,_std::allocator<int>_> *)local_7788);
  tinyusdz::Attribute::set_var
            ((Attribute *)
             &uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(PrimVar *)&uvIndexProp._has_custom);
  tinyusdz::Property::Property
            ((Property *)local_7db8,
             (Attribute *)
             &uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,false);
  pVar5 = std::
          map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
          ::emplace<char_const(&)[20],tinyusdz::Property&>
                    ((map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
                      *)&mesh.super_GPrim.proxyPrim._relationship._varying_authored,
                     (char (*) [20])"primvars:uv:indices",(Property *)local_7db8);
  attrib._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pVar5.first._M_node;
  tinyusdz::Property::~Property((Property *)local_7db8);
  tinyusdz::primvar::PrimVar::~PrimVar((PrimVar *)&uvIndexProp._has_custom);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_7788);
  tinyusdz::Attribute::~Attribute
            ((Attribute *)
             &uvIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  tinyusdz::Property::~Property((Property *)local_74b8);
  tinyusdz::AttrMetas::~AttrMetas((AttrMetas *)local_6ec8);
  std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::~vector
            ((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *)
             local_6ca0);
  tinyusdz::Attribute::~Attribute
            ((Attribute *)
             &uvs.
              super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tinyusdz::Attribute::Attribute((Attribute *)&myvalue);
  var._ts._dirty = false;
  var._ts._25_7_ = 0x40080000000000;
  tinyusdz::primvar::PrimVar::PrimVar
            ((PrimVar *)
             &meta_1.stringData.
              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tinyusdz::primvar::PrimVar::set_value<double>
            ((PrimVar *)
             &meta_1.stringData.
              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(double *)&var._ts._dirty);
  tinyusdz::Attribute::set_var
            ((Attribute *)&myvalue,
             (PrimVar *)
             &meta_1.stringData.
              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pVVar3 = tinyusdz::Attribute::variability((Attribute *)&myvalue);
  *pVVar3 = Uniform;
  tinyusdz::AttrMetas::AttrMetas((AttrMetas *)local_82c0);
  prop._1501_1_ = 0;
  nonstd::optional_lite::optional<bool>::optional<bool,_0>
            ((optional<bool> *)&prop.field_0x5de,(bool *)&prop.field_0x5dd);
  nonstd::optional_lite::optional<bool>::operator=
            ((optional<bool> *)&meta_1.elementSize,(optional<bool> *)&prop.field_0x5de);
  nonstd::optional_lite::optional<bool>::~optional((optional<bool> *)&prop.field_0x5de);
  pAVar2 = tinyusdz::Attribute::metas((Attribute *)&myvalue);
  tinyusdz::AttrMetas::operator=(pAVar2,(AttrMetas *)local_82c0);
  tinyusdz::Property::Property((Property *)local_88a8,(Attribute *)&myvalue,true);
  std::
  map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
  ::emplace<char_const(&)[8],tinyusdz::Property&>
            ((map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
              *)&mesh.super_GPrim.proxyPrim._relationship._varying_authored,(char (*) [8])"myvalue",
             (Property *)local_88a8);
  tinyusdz::Property::~Property((Property *)local_88a8);
  tinyusdz::AttrMetas::~AttrMetas((AttrMetas *)local_82c0);
  tinyusdz::primvar::PrimVar::~PrimVar
            ((PrimVar *)
             &meta_1.stringData.
              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tinyusdz::Attribute::~Attribute((Attribute *)&myvalue);
  tinyusdz::Prim::Prim<tinyusdz::GeomMesh>
            ((Prim *)&xformPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (GeomMesh *)
             &pts.
              super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tinyusdz::Prim::Prim<tinyusdz::Xform>((Prim *)local_8f58,(Xform *)local_1e78);
  pvVar4 = tinyusdz::Prim::children((Prim *)local_8f58);
  std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
            (pvVar4,(Prim *)&xformPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count
            );
  pvVar4 = tinyusdz::Stage::root_prims
                     ((Stage *)xform.super_GPrim._variantSetMap._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count);
  std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
            (pvVar4,(Prim *)local_8f58);
  tinyusdz::Prim::~Prim((Prim *)local_8f58);
  tinyusdz::Prim::~Prim
            ((Prim *)&xformPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  tinyusdz::GeomMesh::~GeomMesh
            ((GeomMesh *)
             &pts.
              super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tinyusdz::XformOp::~XformOp((XformOp *)(translate._M_elems + 2));
  tinyusdz::Xform::~Xform((Xform *)local_1e78);
  return;
}

Assistant:

void SimpleScene(tinyusdz::Stage *stage)
{
  //
  // tinyusdz currently does not provide scene construction API yet, so edit parameters directly.
  //
  // TinyUSDZ does not use mutex, smart pointers(e.g. shared_ptr) and C++ exception.
  // API is not multi-thread safe, thus if you need to manipulate a scene in multi-threaded context,
  // The app must take care of resource locks in app layer.
  //
  tinyusdz::Xform xform;
  xform.name = "root";

  tinyusdz::XformOp op;
  op.op_type = tinyusdz::XformOp::OpType::Translate;
  tinyusdz::value::double3 translate;
  translate[0] = 1.0;
  translate[1] = 2.0;
  translate[2] = 3.0;
  op.set_value(translate);

  xform.xformOps.push_back(op);

  tinyusdz::GeomMesh mesh;
  mesh.name = "quad";

  {
    std::vector<tinyusdz::value::point3f> pts;
    pts.push_back({0.0f, 0.0f, 0.0f});

    pts.push_back({1.0f, 0.0f, 0.0f});

    pts.push_back({1.0f, 1.0f, 0.0f});

    pts.push_back({0.0f, 1.0f, 0.0f});

    mesh.points.set_value(pts);
  }

  {
    // quad plane composed of 2 triangles.
    std::vector<int> indices;
    std::vector<int> counts;
    counts.push_back(3);
    counts.push_back(3);
    mesh.faceVertexCounts.set_value(counts);

    indices.push_back(0);
    indices.push_back(1);
    indices.push_back(2);

    indices.push_back(0);
    indices.push_back(2);
    indices.push_back(3);

    mesh.faceVertexIndices.set_value(indices);
  }

  // primvar and custom attribute can be added to generic Property container `props`
  {
    // primvar is simply an attribute with prefix `primvars:`
    //
    // texCoord2f[] primvars:uv = [ ... ] ( interpolation = "vertex" )
    // int[] primvars:uv:indices = [ ... ]
    //
    {
      tinyusdz::Attribute uvAttr;
      std::vector<tinyusdz::value::texcoord2f> uvs;

      uvs.push_back({0.0f, 0.0f});
      uvs.push_back({1.0f, 0.0f});
      uvs.push_back({1.0f, 1.0f});
      uvs.push_back({0.0f, 1.0f});

      // Fast path. Set the value directly to Attribute.
      uvAttr.set_value(uvs);

      // or we can first build primvar::PrimVar
      //tinyusdz::primvar::PrimVar uvVar;
      //uvVar.set_value(uvs);
      //uvAttr.set_var(std::move(uvVar));

      // Currently `interpolation` is described in Attribute metadataum.
      tinyusdz::AttrMeta meta;
      meta.interpolation = tinyusdz::Interpolation::Vertex;
      uvAttr.metas() = meta;

      tinyusdz::Property uvProp(uvAttr, /* custom*/false);

      mesh.props.emplace("primvars:uv", uvProp);

      // ----------------------

      tinyusdz::Attribute uvIndexAttr;
      std::vector<int> uvIndices;

      // FIXME: Validate
      uvIndices.push_back(0);
      uvIndices.push_back(1);
      uvIndices.push_back(2);
      uvIndices.push_back(3);


      tinyusdz::primvar::PrimVar uvIndexVar;
      uvIndexVar.set_value(uvIndices);
      uvIndexAttr.set_var(std::move(uvIndexVar));

      tinyusdz::Property uvIndexProp(uvIndexAttr, /* custom*/false);
      mesh.props.emplace("primvars:uv:indices", uvIndexProp);

    }

    // `custom uniform double myvalue = 3.0 ( hidden = 0 )`
    {
      tinyusdz::Attribute attrib;
      double myvalue = 3.0;
      tinyusdz::primvar::PrimVar var;
      var.set_value(myvalue);
      attrib.set_var(std::move(var));

      attrib.variability() = tinyusdz::Variability::Uniform;

      tinyusdz::AttrMeta meta;
      meta.hidden = false;
      attrib.metas() = meta;

      tinyusdz::Property prop(attrib, /* custom*/true);

      mesh.props.emplace("myvalue", prop);
    }

  }

  tinyusdz::Prim meshPrim(mesh);
  tinyusdz::Prim xformPrim(xform);

  // [Xform]
  //  |
  //  +- [Mesh]
  //
  xformPrim.children().emplace_back(std::move(meshPrim));

  stage->root_prims().emplace_back(std::move(xformPrim));
}